

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,string *emsg,bool *changed)

{
  string *this;
  bool bVar1;
  long lVar2;
  StringEntry *pSVar3;
  char *pcVar4;
  undefined7 uVar9;
  size_type sVar5;
  size_t sVar6;
  ostream *poVar7;
  long *plVar8;
  undefined1 *puVar10;
  byte bVar11;
  uint uVar12;
  string *psVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  char *se_name [2];
  StringEntry *se [2];
  cmELF elf;
  ostringstream e;
  cmSystemToolsRPathInfo rp [2];
  undefined1 local_398 [4];
  uint local_394;
  bool *local_390;
  ulong local_388;
  string *local_380;
  string *local_378;
  string *local_370;
  StringEntry *local_368 [2];
  long local_358 [3];
  string *local_340;
  StringEntry *local_338;
  ulong local_330;
  ulong local_328;
  cmELF local_320;
  long *local_2f8 [2];
  long local_2e8 [2];
  undefined1 local_2d8 [16];
  _func_int *local_2c8 [2];
  byte abStack_2b8 [80];
  ios_base local_268 [136];
  ios_base local_1e0 [264];
  size_type local_d8 [2];
  ulong local_c8 [2];
  undefined1 local_b8 [16];
  string local_a8 [8];
  ulong local_a0 [11];
  long local_48 [3];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar2 = 0xa0;
  puVar10 = local_b8;
  do {
    *(undefined1 **)(puVar10 + -0x10) = puVar10;
    *(undefined8 *)(puVar10 + -8) = 0;
    *puVar10 = 0;
    *(undefined1 **)(puVar10 + 0x10) = puVar10 + 0x20;
    *(undefined8 *)(puVar10 + 0x18) = 0;
    puVar10[0x20] = 0;
    puVar10 = puVar10 + 0x50;
    lVar2 = lVar2 + -0x50;
  } while (lVar2 != 0);
  local_378 = newRPath;
  local_370 = oldRPath;
  cmELF::cmELF(&local_320,(file->_M_dataplus)._M_p);
  local_358[0] = 0;
  local_358[1] = 0;
  local_368[0] = (StringEntry *)0x0;
  local_368[1] = (StringEntry *)0x0;
  pSVar3 = cmELF::GetRPath(&local_320);
  if (pSVar3 != (StringEntry *)0x0) {
    local_368[0] = (StringEntry *)0x5ccde7;
    local_358[0] = (long)pSVar3;
  }
  uVar12 = (uint)(pSVar3 != (StringEntry *)0x0);
  pcVar4 = (char *)cmELF::GetRunPath(&local_320);
  if ((StringEntry *)pcVar4 != (StringEntry *)0x0) {
    *(char **)((long)local_358 + (ulong)(uVar12 * 8)) = pcVar4;
    pcVar4 = "RUNPATH";
    *(char **)((long)local_368 + (ulong)(uVar12 * 8)) = "RUNPATH";
    uVar12 = uVar12 + 1;
  }
  uVar9 = (undefined7)((ulong)pcVar4 >> 8);
  if (uVar12 == 0) {
    local_394 = (uint)CONCAT71(uVar9,1);
    if (local_378->_M_string_length == 0) {
      uVar12 = 0;
      bVar16 = false;
      bVar1 = true;
    }
    else {
      if (emsg == (string *)0x0) {
        bVar16 = false;
        goto LAB_0026a937;
      }
      uVar12 = 0;
      std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x5afaf6);
      std::__cxx11::string::_M_append((char *)emsg,(ulong)local_320.ErrorMessage._M_dataplus._M_p);
      bVar16 = false;
      bVar1 = false;
    }
  }
  else if (uVar12 == 0) {
    local_394 = (uint)CONCAT71(uVar9,1);
    bVar16 = true;
LAB_0026a937:
    uVar12 = 0;
    bVar1 = false;
  }
  else {
    local_340 = file;
    local_328 = (ulong)uVar12;
    local_394 = 1;
    uVar14 = 0;
    uVar15 = 0;
    local_390 = changed;
    local_380 = emsg;
    do {
      if (((int)uVar15 == 0) || (local_d8[0] != *(size_type *)(local_358[uVar14] + 0x20))) {
        psVar13 = (string *)local_358[uVar14];
        sVar5 = cmSystemToolsFindRPath(psVar13,local_370);
        local_388 = uVar15;
        if (sVar5 == 0xffffffffffffffff) {
          sVar5 = cmSystemToolsFindRPath(psVar13,local_378);
          bVar16 = sVar5 != 0xffffffffffffffff;
          uVar12 = local_394 & 0xff;
          if (bVar16) {
            uVar12 = 0;
          }
          if (emsg == (string *)0x0 || bVar16) {
            bVar11 = bVar16 * '\x03' + 1;
            local_394 = uVar12;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,"The current ",0xc);
            pSVar3 = local_368[uVar14];
            if (pSVar3 == (StringEntry *)0x0) {
              std::ios::clear((int)(local_398 + (long)*(_func_int **)(local_2d8._0_8_ + -0x18)) +
                              0xc0);
            }
            else {
              sVar6 = strlen((char *)pSVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,(char *)pSVar3,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8," is:\n",5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"  ",2);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2d8,(psVar13->_M_dataplus)._M_p,
                                psVar13->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"which does not contain:\n",0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(local_370->_M_dataplus)._M_p,local_370->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"as was expected.",0x10);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)emsg,(string *)local_2f8);
            if (local_2f8[0] != local_2e8) {
              operator_delete(local_2f8[0],local_2e8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
            std::ios_base::~ios_base(local_268);
            bVar11 = 1;
          }
        }
        else {
          lVar2 = (long)(int)uVar15;
          local_d8[lVar2 * 10] = (size_type)psVar13[1]._M_dataplus._M_p;
          local_d8[lVar2 * 10 + 1] = psVar13[1]._M_string_length;
          local_330 = uVar14;
          pSVar3 = local_368[uVar14];
          pcVar4 = (char *)local_c8[lVar2 * 10 + 1];
          strlen((char *)pSVar3);
          local_338 = pSVar3;
          std::__cxx11::string::_M_replace((ulong)(local_c8 + lVar2 * 10),0,pcVar4,(ulong)pSVar3);
          std::__cxx11::string::substr((ulong)local_2d8,(ulong)psVar13);
          uVar14 = local_330;
          this = local_a8 + lVar2 * 0x50;
          std::__cxx11::string::operator=(this,(string *)local_2d8);
          if ((_func_int **)local_2d8._0_8_ != local_2c8) {
            operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0] + 1));
          }
          std::__cxx11::string::_M_append((char *)this,(ulong)(local_378->_M_dataplus)._M_p);
          emsg = local_380;
          std::__cxx11::string::substr((ulong)local_2d8,(ulong)psVar13);
          std::__cxx11::string::_M_append((char *)this,local_2d8._0_8_);
          if ((_func_int **)local_2d8._0_8_ != local_2c8) {
            operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0] + 1));
          }
          local_394 = local_394 & 0xff;
          if (local_a0[lVar2 * 10] != 0) {
            local_394 = 0;
          }
          if (local_d8[lVar2 * 10 + 1] < local_a0[lVar2 * 10] + 1) {
            bVar11 = 1;
            if (emsg != (string *)0x0) {
              std::__cxx11::string::_M_replace
                        ((ulong)emsg,0,(char *)emsg->_M_string_length,0x5afb66);
              std::__cxx11::string::append((char *)emsg);
              std::__cxx11::string::append((char *)emsg);
            }
          }
          else {
            local_388 = (ulong)((int)local_388 + 1);
            bVar11 = 0;
          }
        }
        uVar15 = local_388;
        if ((bVar11 & 3) != 0) goto LAB_0026a8b3;
      }
      uVar14 = uVar14 + 1;
    } while (local_328 != uVar14);
    bVar11 = 0;
LAB_0026a8b3:
    uVar12 = (uint)uVar15;
    bVar16 = (bVar11 & 5) == 0;
    bVar1 = false;
    file = local_340;
    changed = local_390;
  }
  cmELF::~cmELF(&local_320);
  if (!bVar16) goto LAB_0026ab61;
  if (uVar12 != 0) {
    if ((local_394 & 1) != 0) {
      bVar1 = RemoveRPath(file,emsg,changed);
      goto LAB_0026ab61;
    }
    std::ofstream::ofstream(local_2d8,(file->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
    if ((abStack_2b8[(long)*(_func_int **)(local_2d8._0_8_ + -0x18)] & 5) == 0) {
      bVar16 = (int)uVar12 < 1;
      if (0 < (int)uVar12) {
        local_388 = (ulong)uVar12;
        uVar14 = 0;
        local_390 = changed;
        local_380 = emsg;
        do {
          plVar8 = (long *)std::ostream::seekp((ostream *)local_2d8,local_d8[uVar14 * 10],0);
          psVar13 = local_380;
          if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
            if (local_380 != (string *)0x0) {
              std::__cxx11::string::operator=((string *)local_380,"Error seeking to ");
              changed = local_390;
              std::__cxx11::string::_M_append((char *)psVar13,local_c8[uVar14 * 10]);
LAB_0026aafd:
              std::__cxx11::string::append((char *)psVar13);
              goto LAB_0026ab05;
            }
            bVar16 = false;
            bVar1 = false;
            changed = local_390;
            break;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2d8,*(char **)(local_a8 + uVar14 * 0x50),local_a0[uVar14 * 10]
                    );
          for (uVar15 = local_a0[uVar14 * 10]; psVar13 = local_380, changed = local_390,
              uVar15 < local_d8[uVar14 * 10 + 1]; uVar15 = uVar15 + 1) {
            local_320.Internal._0_1_ = 0;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,(char *)&local_320,1);
          }
          if ((abStack_2b8[(long)*(_func_int **)(local_2d8._0_8_ + -0x18)] & 5) != 0) {
            if (local_380 != (string *)0x0) {
              std::__cxx11::string::operator=((string *)local_380,"Error writing the new ");
              std::__cxx11::string::_M_append((char *)psVar13,local_c8[uVar14 * 10]);
              goto LAB_0026aafd;
            }
            goto LAB_0026ab05;
          }
          uVar14 = uVar14 + 1;
          bVar16 = local_388 <= uVar14;
        } while (uVar14 != local_388);
      }
    }
    else if (emsg == (string *)0x0) {
LAB_0026ab05:
      bVar16 = false;
      bVar1 = false;
    }
    else {
      bVar16 = false;
      std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x5afb98);
      bVar1 = false;
    }
    local_2d8._0_8_ = _VTT;
    *(undefined8 *)(local_2d8 + (long)_VTT[-3]) = _vtable;
    std::filebuf::~filebuf((filebuf *)(local_2d8 + 8));
    std::ios_base::~ios_base(local_1e0);
    bVar1 = (bool)(bVar1 | bVar16);
    if ((changed == (bool *)0x0) || (bVar16 == false)) goto LAB_0026ab61;
    *changed = true;
  }
  bVar1 = true;
LAB_0026ab61:
  lVar2 = -0xa0;
  plVar8 = local_48;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    if (plVar8 + -4 != (long *)plVar8[-6]) {
      operator_delete((long *)plVar8[-6],plVar8[-4] + 1);
    }
    plVar8 = plVar8 + -10;
    lVar2 = lVar2 + 0x50;
  } while (lVar2 != 0);
  return bVar1;
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath, std::string* emsg,
                                bool* changed)
{
  if (changed) {
    *changed = false;
  }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());

    // Get the RPATH and RUNPATH entries from it.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { nullptr, nullptr };
    const char* se_name[2] = { nullptr, nullptr };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count] = se_rpath;
      se_name[se_count] = "RPATH";
      ++se_count;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count] = se_runpath;
      se_name[se_count] = "RUNPATH";
      ++se_count;
    }
    if (se_count == 0) {
      if (newRPath.empty()) {
        // The new rpath is empty and there is no rpath anyway so it is
        // okay.
        return true;
      }
      if (emsg) {
        *emsg = "No valid ELF RPATH or RUNPATH entry exists in the file; ";
        *emsg += elf.GetErrorMessage();
      }
      return false;
    }

    for (int i = 0; i < se_count; ++i) {
      // If both RPATH and RUNPATH refer to the same string literal it
      // needs to be changed only once.
      if (rp_count && rp[0].Position == se[i]->Position) {
        continue;
      }

      // Make sure the current rpath contains the old rpath.
      std::string::size_type pos =
        cmSystemToolsFindRPath(se[i]->Value, oldRPath);
      if (pos == std::string::npos) {
        // If it contains the new rpath instead then it is okay.
        if (cmSystemToolsFindRPath(se[i]->Value, newRPath) !=
            std::string::npos) {
          remove_rpath = false;
          continue;
        }
        if (emsg) {
          std::ostringstream e;
          /* clang-format off */
        e << "The current " << se_name[i] << " is:\n"
          << "  " << se[i]->Value << "\n"
          << "which does not contain:\n"
          << "  " << oldRPath << "\n"
          << "as was expected.";
          /* clang-format on */
          *emsg = e.str();
        }
        return false;
      }

      // Store information about the entry in the file.
      rp[rp_count].Position = se[i]->Position;
      rp[rp_count].Size = se[i]->Size;
      rp[rp_count].Name = se_name[i];

      std::string::size_type prefix_len = pos;

      // If oldRPath was at the end of the file's RPath, and newRPath is empty,
      // we should remove the unnecessary ':' at the end.
      if (newRPath.empty() && pos > 0 && se[i]->Value[pos - 1] == ':' &&
          pos + oldRPath.length() == se[i]->Value.length()) {
        prefix_len--;
      }

      // Construct the new value which preserves the part of the path
      // not being changed.
      rp[rp_count].Value = se[i]->Value.substr(0, prefix_len);
      rp[rp_count].Value += newRPath;
      rp[rp_count].Value += se[i]->Value.substr(pos + oldRPath.length());

      if (!rp[rp_count].Value.empty()) {
        remove_rpath = false;
      }

      // Make sure there is enough room to store the new rpath and at
      // least one null terminator.
      if (rp[rp_count].Size < rp[rp_count].Value.length() + 1) {
        if (emsg) {
          *emsg = "The replacement path is too long for the ";
          *emsg += se_name[i];
          *emsg += " entry.";
        }
        return false;
      }

      // This entry is ready for update.
      ++rp_count;
    }
  }

  // If no runtime path needs to be changed, we are done.
  if (rp_count == 0) {
    return true;
  }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath) {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
  }

  {
    // Open the file for update.
    cmsys::ofstream f(file.c_str(),
                      std::ios::in | std::ios::out | std::ios::binary);
    if (!f) {
      if (emsg) {
        *emsg = "Error opening file for update.";
      }
      return false;
    }

    // Store the new RPATH and RUNPATH strings.
    for (int i = 0; i < rp_count; ++i) {
      // Seek to the RPATH position.
      if (!f.seekp(rp[i].Position)) {
        if (emsg) {
          *emsg = "Error seeking to ";
          *emsg += rp[i].Name;
          *emsg += " position.";
        }
        return false;
      }

      // Write the new rpath.  Follow it with enough null terminators to
      // fill the string table entry.
      f << rp[i].Value;
      for (unsigned long j = rp[i].Value.length(); j < rp[i].Size; ++j) {
        f << '\0';
      }

      // Make sure it wrote correctly.
      if (!f) {
        if (emsg) {
          *emsg = "Error writing the new ";
          *emsg += rp[i].Name;
          *emsg += " string to the file.";
        }
        return false;
      }
    }
  }

  // Everything was updated successfully.
  if (changed) {
    *changed = true;
  }
  return true;
}